

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O3

void print_message<char[25],__2>
               (Printer *printer,anon_class_1_0_00000001 *color,char *severity,char (*t) [25])

{
  anon_class_1_0_00000001 aVar1;
  anon_class_1_0_00000001 *paVar2;
  char *local_70;
  Format<const_char_*> local_68;
  PrintTuple<char[6],_Format<const_char_*>,_char[6]> local_50;
  PrintTuple<char[5],_PrintTuple<char[6],_Format<const_char_*>,_char[6]>,_char[6]> local_30;
  
  local_68.t.t0 = &local_70;
  local_70 = "error";
  local_50.t.t0 = &local_68;
  local_68.s = "%: ";
  local_30.t.t0 = &local_50;
  local_50.t0 = (char (*) [6])0x13aa90;
  local_50.t.t.t0 = (char (*) [6])0x13a653;
  local_30.t0 = (char (*) [5])0x13a642;
  local_30.t.t.t0 = (char (*) [6])0x13a647;
  PrintTuple<char[5],_PrintTuple<char[6],_Format<const_char_*>,_char[6]>,_char[6]>::print
            (&local_30,printer);
  aVar1 = *color;
  paVar2 = color;
  while (aVar1 != (anon_class_1_0_00000001)0x0) {
    aVar1 = paVar2[1];
    paVar2 = paVar2 + 1;
  }
  std::ostream::write((char *)printer->ostream,(long)color);
  std::ostream::put((char)printer->ostream);
  return;
}

Assistant:

void print_message(const Printer& printer, const C& color, const char* severity, const T& t) {
	printer.print(bold(color(format("%: ", severity))));
	printer.print(t);
	printer.print('\n');
}